

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void OpenSteer::deferredDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  undefined8 uStack_50;
  Color CStack_40;
  
  Color::Color(&CStack_40);
  puVar6 = DAT_0017cc08;
  puVar5 = (anonymous_namespace)::DeferredLine::lines;
  uVar1 = startPoint->z;
  uVar3._0_4_ = startPoint->x;
  uVar3._4_4_ = startPoint->y;
  uStack_50 = CONCAT44(endPoint->x,uVar1);
  uVar2._0_4_ = endPoint->y;
  uVar2._4_4_ = endPoint->z;
  CStack_40.r_ = color->r_;
  CStack_40.g_ = color->g_;
  CStack_40.b_ = color->b_;
  CStack_40.a_ = color->a_;
  if (DAT_0017cc08 == DAT_0017cc10) {
    if ((long)DAT_0017cc08 - (long)(anonymous_namespace)::DeferredLine::lines == 0x7ffffffffffffff8)
    {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar7 = (long)DAT_0017cc08 - (long)(anonymous_namespace)::DeferredLine::lines >> 3;
    uVar12 = lVar7 * -0x3333333333333333;
    uVar8 = 1;
    if (DAT_0017cc08 != (anonymous_namespace)::DeferredLine::lines) {
      uVar8 = uVar12;
    }
    uVar11 = uVar8 + uVar12;
    if (0x333333333333332 < uVar11) {
      uVar11 = 0x333333333333333;
    }
    if (CARRY8(uVar8,uVar12)) {
      uVar11 = 0x333333333333333;
    }
    if (uVar11 == 0) {
      puVar9 = (undefined8 *)0x0;
    }
    else {
      puVar9 = (undefined8 *)operator_new(uVar11 * 0x28);
    }
    puVar9[lVar7 + 4] = CStack_40._8_8_;
    puVar9[lVar7 + 2] = uVar2;
    (puVar9 + lVar7 + 2)[1] = CStack_40._0_8_;
    puVar9[lVar7] = uVar3;
    (puVar9 + lVar7)[1] = uStack_50;
    puVar13 = puVar9;
    for (puVar10 = puVar5; puVar6 != puVar10; puVar10 = puVar10 + 5) {
      puVar13[4] = puVar10[4];
      uVar2 = *puVar10;
      uVar3 = puVar10[1];
      uVar4 = puVar10[3];
      puVar13[2] = puVar10[2];
      puVar13[3] = uVar4;
      *puVar13 = uVar2;
      puVar13[1] = uVar3;
      puVar13 = puVar13 + 5;
    }
    if (puVar5 != (undefined8 *)0x0) {
      operator_delete(puVar5,(long)DAT_0017cc10 - (long)puVar5);
    }
    DAT_0017cc10 = puVar9 + uVar11 * 5;
    (anonymous_namespace)::DeferredLine::lines = puVar9;
  }
  else {
    DAT_0017cc08[4] = CStack_40._8_8_;
    DAT_0017cc08[2] = uVar2;
    DAT_0017cc08[3] = CStack_40._0_8_;
    *DAT_0017cc08 = uVar3;
    DAT_0017cc08[1] = uStack_50;
    puVar13 = DAT_0017cc08;
  }
  DAT_0017cc08 = puVar13 + 5;
  return;
}

Assistant:

void 
OpenSteer::deferredDrawLine (const Vec3& startPoint,
                             const Vec3& endPoint,
                             const Color& color)
{
    DeferredLine::addToBuffer (startPoint, endPoint, color);
}